

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2Bug18391750(void)

{
  once_flag *this;
  bool bVar1;
  ostream *poVar2;
  StringPiece local_2e0;
  LogMessage local_2d0;
  StringPiece local_140;
  undefined1 local_130 [8];
  RE2 re;
  Options opt;
  char t [36];
  
  opt.literal_ = true;
  opt.never_nl_ = true;
  opt.dot_nl_ = true;
  opt.never_capture_ = true;
  opt.case_sensitive_ = true;
  opt.perl_classes_ = true;
  opt.word_boundary_ = true;
  opt.one_line_ = true;
  this = &re.named_groups_once_;
  RE2::Options::Options((Options *)this);
  RE2::Options::set_encoding((Options *)this,EncodingLatin1);
  RE2::Options::set_longest_match((Options *)this,true);
  RE2::Options::set_dot_nl((Options *)this,true);
  RE2::Options::set_case_sensitive((Options *)this,false);
  StringPiece::StringPiece(&local_140,&opt.literal_);
  RE2::RE2((RE2 *)local_130,&local_140,(Options *)this);
  bVar1 = RE2::ok((RE2 *)local_130);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5f8);
    poVar2 = LogMessage::stream(&local_2d0);
    std::operator<<(poVar2,"Check failed: re.ok()");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2d0);
  }
  StringPiece::StringPiece(&local_2e0,&opt.literal_);
  RE2::PartialMatch<>(&local_2e0,(RE2 *)local_130);
  RE2::~RE2((RE2 *)local_130);
  return;
}

Assistant:

TEST(RE2, Bug18391750) {
  // Stray write past end of match_ in nfa.cc, caught by fuzzing + address sanitizer.
  const char t[] = {
      (char)0x28, (char)0x28, (char)0xfc, (char)0xfc, (char)0x08, (char)0x08,
      (char)0x26, (char)0x26, (char)0x28, (char)0xc2, (char)0x9b, (char)0xc5,
      (char)0xc5, (char)0xd4, (char)0x8f, (char)0x8f, (char)0x69, (char)0x69,
      (char)0xe7, (char)0x29, (char)0x7b, (char)0x37, (char)0x31, (char)0x31,
      (char)0x7d, (char)0xae, (char)0x7c, (char)0x7c, (char)0xf3, (char)0x29,
      (char)0xae, (char)0xae, (char)0x2e, (char)0x2a, (char)0x29, (char)0x00,
  };
  RE2::Options opt;
  opt.set_encoding(RE2::Options::EncodingLatin1);
  opt.set_longest_match(true);
  opt.set_dot_nl(true);
  opt.set_case_sensitive(false);
  RE2 re(t, opt);
  CHECK(re.ok());
  RE2::PartialMatch(t, re);
}